

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall wabt::SharedValidator::OnLoop(SharedValidator *this,Location *loc,Type sig_type)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  TypeVector param_types;
  TypeVector result_types;
  TypeVector local_68;
  TypeVector local_48;
  
  RVar1 = CheckInstr(this,(Opcode)0x3,loc);
  local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  RVar2 = CheckBlockSignature(this,loc,(Opcode)0x3,sig_type,&local_68,&local_48);
  RVar3 = TypeChecker::OnLoop(&this->typechecker_,&local_68,&local_48);
  if (local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnLoop(const Location& loc, Type sig_type) {
  Result result = CheckInstr(Opcode::Loop, loc);
  TypeVector param_types, result_types;
  result |= CheckBlockSignature(loc, Opcode::Loop, sig_type, &param_types,
                                &result_types);
  result |= typechecker_.OnLoop(param_types, result_types);
  return result;
}